

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_sort(kvtree *hash,int direction)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct *pkVar2;
  char *pcVar3;
  __compar_fn_t local_40;
  _func_int_void_ptr_void_ptr *fn;
  char *key;
  kvtree_elem *pkStack_28;
  int index;
  kvtree_elem *elem;
  sort_elem_str *list;
  int count;
  int direction_local;
  kvtree *hash_local;
  
  list._4_4_ = direction;
  _count = hash;
  list._0_4_ = kvtree_size(hash);
  elem = (kvtree_elem *)
         kvtree_malloc((long)(int)list << 4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                       ,0x23e);
  key._4_4_ = 0;
  for (pkStack_28 = kvtree_elem_first(_count); pkStack_28 != (kvtree_elem *)0x0;
      pkStack_28 = kvtree_elem_next(pkStack_28)) {
    pcVar3 = kvtree_elem_key(pkStack_28);
    (&elem->key)[(long)key._4_4_ * 2] = pcVar3;
    (&elem->hash)[(long)key._4_4_ * 2] = (kvtree_struct *)pkStack_28;
    key._4_4_ = key._4_4_ + 1;
  }
  local_40 = kvtree_cmp_fn_str_asc;
  if (list._4_4_ == 1) {
    local_40 = kvtree_cmp_fn_str_desc;
  }
  qsort(elem,(long)(int)list,0x10,local_40);
  while (0 < key._4_4_) {
    key._4_4_ = key._4_4_ + -1;
    pkVar1 = (kvtree_elem_struct *)(&elem->hash)[(long)key._4_4_ * 2];
    if ((pkVar1->pointers).le_next != (kvtree_elem_struct *)0x0) {
      (((pkVar1->pointers).le_next)->pointers).le_prev = (pkVar1->pointers).le_prev;
    }
    *(pkVar1->pointers).le_prev = (pkVar1->pointers).le_next;
    pkVar2 = _count->lh_first;
    (pkVar1->pointers).le_next = pkVar2;
    if (pkVar2 != (kvtree_elem_struct *)0x0) {
      (_count->lh_first->pointers).le_prev = &(pkVar1->pointers).le_next;
    }
    _count->lh_first = pkVar1;
    (pkVar1->pointers).le_prev = &_count->lh_first;
  }
  kvtree_free(&elem);
  return 0;
}

Assistant:

int kvtree_sort(kvtree* hash, int direction)
{
  /* get the size of the hash */
  int count = kvtree_size(hash);

  /* allocate space for each element */
  struct sort_elem_str* list = (struct sort_elem_str*) KVTREE_MALLOC(count * sizeof(struct sort_elem_str));

  /* walk the hash and fill in the keys */
  kvtree_elem* elem = NULL;
  int index = 0;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    char* key = kvtree_elem_key(elem);
    list[index].key = key;
    list[index].addr = elem;
    index++;
  }

  /* sort the elements by key */
  int (*fn)(const void* a, const void* b) = NULL;
  fn = &kvtree_cmp_fn_str_asc;
  if (direction == KVTREE_SORT_DESCENDING) {
    fn = &kvtree_cmp_fn_str_desc;
  }
  qsort(list, count, sizeof(struct sort_elem_str), fn);

  /* walk the sorted list backwards, extracting the element by address,
   * and inserting at the head */
  while (index > 0) {
    index--;
    elem = list[index].addr;
    LIST_REMOVE(elem, pointers);
    LIST_INSERT_HEAD(hash, elem, pointers);
  }

  /* free the list */
  kvtree_free(&list);

  return KVTREE_SUCCESS;
}